

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_function_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::CreateTableFunctionInfo::GetAlterInfo(CreateTableFunctionInfo *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long in_RSI;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  AlterEntryData local_98;
  
  local_b8 = &local_a8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,*(long *)(in_RSI + 0x10),
             *(long *)(in_RSI + 0x18) + *(long *)(in_RSI + 0x10));
  local_d8 = &local_c8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,*(long *)(in_RSI + 0x30),
             *(long *)(in_RSI + 0x38) + *(long *)(in_RSI + 0x30));
  local_f8 = &local_e8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,*(long *)(in_RSI + 0x128),
             *(long *)(in_RSI + 0x130) + *(long *)(in_RSI + 0x128));
  local_98.catalog._M_dataplus._M_p = (pointer)&local_98.catalog.field_2;
  if (local_b8 == &local_a8) {
    local_98.catalog.field_2._8_8_ = local_a8._8_8_;
  }
  else {
    local_98.catalog._M_dataplus._M_p = (pointer)local_b8;
  }
  paVar1 = &local_98.schema.field_2;
  local_98.catalog._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  if (local_d8 == &local_c8) {
    local_98.schema.field_2._8_8_ = local_c8._8_8_;
    local_98.schema._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.schema._M_dataplus._M_p = (pointer)local_d8;
  }
  paVar2 = &local_98.name.field_2;
  local_98.schema._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  if (local_f8 == &local_e8) {
    local_98.name.field_2._8_8_ = local_e8._8_8_;
    local_98.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.name._M_dataplus._M_p = (pointer)local_f8;
  }
  local_98.name._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_98.if_not_found = RETURN_NULL;
  local_f8 = &local_e8;
  local_d8 = &local_c8;
  local_b8 = &local_a8;
  make_uniq_base<duckdb::AlterInfo,duckdb::AddTableFunctionOverloadInfo,duckdb::AlterEntryData,duckdb::TableFunctionSet_const&>
            ((duckdb *)this,&local_98,(TableFunctionSet *)(in_RSI + 0x180));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p != &local_98.catalog.field_2) {
    operator_delete(local_98.catalog._M_dataplus._M_p);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> CreateTableFunctionInfo::GetAlterInfo() const {
	return make_uniq_base<AlterInfo, AddTableFunctionOverloadInfo>(
	    AlterEntryData(catalog, schema, name, OnEntryNotFound::RETURN_NULL), functions);
}